

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O3

void cumt(double *t,double *df,double *cum,double *ccum)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *t * *t;
  dVar3 = dVar2 + *df;
  cumt::xx = *df / dVar3;
  cumt::yy = dVar2 / dVar3;
  cumt::T1 = *df * 0.5;
  cumbet(&cumt::xx,&cumt::yy,&cumt::T1,&cumt::K2,&cumt::a,&cumt::oma);
  dVar2 = cumt::a * 0.5;
  pdVar1 = ccum;
  if (0.0 < *t) {
    pdVar1 = cum;
    cum = ccum;
  }
  *cum = dVar2;
  *pdVar1 = dVar2 + cumt::oma;
  return;
}

Assistant:

void cumt ( double *t, double *df, double *cum, double *ccum )

//****************************************************************************80
//
//  Purpose:
//
//    CUMT evaluates the cumulative T distribution.
//
//  Reference:
//
//    Milton Abramowitz and Irene Stegun,
//    Handbook of Mathematical Functions,
//    Formula 26.5.27.
//
//  Parameters:
//
//    Input, double *T, the upper limit of integration.
//
//    Input, double *DF, the number of degrees of freedom of
//    the T distribution.
//
//    Output, double *CUM, *CCUM, the T distribution CDF and
//    complementary CDF.
//
{
  static double a;
  static double dfptt;
  static double K2 = 0.5e0;
  static double oma;
  static double T1;
  static double tt;
  static double xx;
  static double yy;

  tt = (*t) * (*t);
  dfptt = ( *df ) + tt;
  xx = *df / dfptt;
  yy = tt / dfptt;
  T1 = 0.5e0 * ( *df );
  cumbet ( &xx, &yy, &T1, &K2, &a, &oma );

  if ( *t <= 0.0e0 )
  {
    *cum = 0.5e0 * a;
    *ccum = oma + ( *cum );
  }
  else
  {
    *ccum = 0.5e0 * a;
    *cum = oma + ( *ccum );
  }
  return;
}